

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

string * __thiscall
punky::tok::type_to_string_abi_cxx11_(string *__return_storage_ptr__,tok *this,TokenType *type)

{
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  tok *local_18;
  TokenType *type_local;
  
  local_18 = this;
  type_local = (TokenType *)__return_storage_ptr__;
  switch(*(undefined4 *)this) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RIGHT_PAREN",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"LEFT_BRACKET",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RIGHT_BRACKET",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"LEFT_BRACE",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RIGHT_BRACE",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"COMMA",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DOT",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"-",&local_34);
    std::allocator<char>::~allocator(&local_34);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"+",&local_35);
    std::allocator<char>::~allocator(&local_35);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"/",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"*",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,":",&local_38);
    std::allocator<char>::~allocator(&local_38);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,";",&local_39);
    std::allocator<char>::~allocator(&local_39);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"!",&local_3a);
    std::allocator<char>::~allocator(&local_3a);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"!=",&local_3b);
    std::allocator<char>::~allocator(&local_3b);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"=",&local_3c);
    std::allocator<char>::~allocator(&local_3c);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"==",&local_3d);
    std::allocator<char>::~allocator(&local_3d);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,">",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    break;
  case 0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,">=",&local_3f);
    std::allocator<char>::~allocator(&local_3f);
    break;
  case 0x14:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<",&local_40);
    std::allocator<char>::~allocator(&local_40);
    break;
  case 0x15:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<=",&local_41);
    std::allocator<char>::~allocator(&local_41);
    break;
  case 0x16:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"IDENTIFIER",&local_42);
    std::allocator<char>::~allocator(&local_42);
    break;
  case 0x17:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"STRING",&local_43);
    std::allocator<char>::~allocator(&local_43);
    break;
  case 0x18:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INT",&local_44);
    std::allocator<char>::~allocator(&local_44);
    break;
  case 0x19:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"fn",&local_45);
    std::allocator<char>::~allocator(&local_45);
    break;
  case 0x1a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"let",&local_46);
    std::allocator<char>::~allocator(&local_46);
    break;
  case 0x1b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"true",&local_47);
    std::allocator<char>::~allocator(&local_47);
    break;
  case 0x1c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"false",&local_48);
    std::allocator<char>::~allocator(&local_48);
    break;
  case 0x1d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"if",&local_49);
    std::allocator<char>::~allocator(&local_49);
    break;
  case 0x1e:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ELSE",&local_4a);
    std::allocator<char>::~allocator(&local_4a);
    break;
  case 0x1f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"return",&local_4b);
    std::allocator<char>::~allocator(&local_4b);
    break;
  case 0x20:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ILLEGAL",&local_4c);
    std::allocator<char>::~allocator(&local_4c);
    break;
  case 0x21:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"EOS",&local_4d);
    std::allocator<char>::~allocator(&local_4d);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DEFAULT - UNREACHABLE",&local_4e);
    std::allocator<char>::~allocator(&local_4e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string type_to_string(const TokenType& type)
{
    switch (type)
    {
        case TokenType::LeftParen:
            return "(";
        case TokenType::RightParen:
            return "RIGHT_PAREN";
        case TokenType::LeftBracket:
            return "LEFT_BRACKET";
        case TokenType::RightBracket:
            return "RIGHT_BRACKET";
        case TokenType::LeftBrace:
            return "LEFT_BRACE";
        case TokenType::RightBrace:
            return "RIGHT_BRACE";
        case TokenType::Comma:
            return "COMMA";
        case TokenType::Dot:
            return "DOT";
        case TokenType::Minus:
            return "-";
        case TokenType::Plus:
            return "+";
        case TokenType::Slash:
            return "/";
        case TokenType::Asterisk:
            return "*";
        case TokenType::Colon:
            return ":";
        case TokenType::Semicolon:
            return ";";
        case TokenType::Bang:
            return "!";
        case TokenType::BangEqual:
            return "!=";
        case TokenType::Equal:
            return "=";
        case TokenType::EqualEqual:
            return "==";
        case TokenType::Greater:
            return ">";
        case TokenType::GreaterEqual:
            return ">=";
        case TokenType::Less:
            return "<";
        case TokenType::LessEqual:
            return "<=";
        case TokenType::Identifier:
            return "IDENTIFIER";
        case TokenType::String:
            return "STRING";
        case TokenType::Int:
            return "INT";
        case TokenType::Func:
            return "fn";
        case TokenType::Let:
            return "let";
        case TokenType::True:
            return "true";
        case TokenType::False:
            return "false";
        case TokenType::If:
            return "if";
        case TokenType::Else:
            return "ELSE";
        case TokenType::Return:
            return "return";
        case TokenType::Illegal:
            return "ILLEGAL";
        case TokenType::EOS:
            return "EOS";
        default:
            return "DEFAULT - UNREACHABLE";
    }
}